

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_mapstore.c
# Opt level: O2

int resize_impl(dds_mapstore *store,int new_length)

{
  double dVar1;
  int iVar2;
  size_t sVar3;
  
  if ((store->resizable == true) && (store->store_type != UNBOUNDED_MAPSTORE)) {
    while( true ) {
      sVar3 = (*store->buckets->_vtable->count)(store->buckets->_object);
      iVar2 = (int)sVar3;
      if (iVar2 <= new_length) break;
      (*store->vtable->collapse)(store);
      if (store->store_type == COLLAPSINGALL_MAPSTORE) {
        dVar1 = store->id_mapping->gamma_value;
        dds_bucket_id_mapping_update(store->id_mapping,dVar1 * dVar1);
      }
    }
  }
  else {
    sVar3 = (*store->buckets->_vtable->count)(store->buckets->_object);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

static int resize_impl(struct dds_mapstore *store, int new_length) {
    if (!store->resizable || store->store_type == UNBOUNDED_MAPSTORE) {
        return dict_count(store->buckets);
    }
    int num_bucks = dict_count(store->buckets);
    while (num_bucks > new_length) {
        dds_mapstore_collapse(store);
        if (store->store_type == COLLAPSINGALL_MAPSTORE)
            dds_bucket_id_mapping_update(store->id_mapping, pow(store->id_mapping->gamma_value,2.0));
        num_bucks = dict_count(store->buckets);
    }
    return num_bucks;
}